

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

xxh_u64 XXH64_finalize(xxh_u64 h64,xxh_u8 *ptr,size_t len,XXH_alignment align)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  long *plVar7;
  
  uVar6 = (ulong)((uint)len & 0x1f);
  uVar2 = (ulong)((uint)len & 0x18);
  uVar5 = uVar6 - uVar2;
  plVar7 = (long *)ptr;
  for (; 7 < uVar6; uVar6 = uVar6 - 8) {
    lVar1 = *plVar7;
    plVar7 = plVar7 + 1;
    uVar3 = (lVar1 * -0x6c158a5880000000 | (ulong)(lVar1 * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ h64;
    h64 = (uVar3 << 0x1b | uVar3 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  }
  puVar4 = (uint *)(ptr + uVar2);
  if (3 < uVar5) {
    uVar2 = (ulong)*puVar4 * -0x61c8864e7a143579 ^ h64;
    puVar4 = puVar4 + 1;
    h64 = (uVar2 << 0x17 | uVar2 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
    uVar5 = uVar5 - 4;
  }
  for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
    uVar6 = (ulong)*(byte *)((long)puVar4 + uVar2) * 0x27d4eb2f165667c5 ^ h64;
    h64 = (uVar6 << 0xb | uVar6 >> 0x35) * -0x61c8864e7a143579;
  }
  uVar2 = (h64 >> 0x21 ^ h64) * -0x3d4d51c2d82b14b1;
  uVar2 = (uVar2 >> 0x1d ^ uVar2) * 0x165667b19e3779f9;
  return uVar2 >> 0x20 ^ uVar2;
}

Assistant:

static xxh_u64
XXH64_finalize(xxh_u64 h64, const xxh_u8* ptr, size_t len, XXH_alignment align)
{
    if (ptr==NULL) XXH_ASSERT(len == 0);
    len &= 31;
    while (len >= 8) {
        xxh_u64 const k1 = XXH64_round(0, XXH_get64bits(ptr));
        ptr += 8;
        h64 ^= k1;
        h64  = XXH_rotl64(h64,27) * XXH_PRIME64_1 + XXH_PRIME64_4;
        len -= 8;
    }
    if (len >= 4) {
        h64 ^= (xxh_u64)(XXH_get32bits(ptr)) * XXH_PRIME64_1;
        ptr += 4;
        h64 = XXH_rotl64(h64, 23) * XXH_PRIME64_2 + XXH_PRIME64_3;
        len -= 4;
    }
    while (len > 0) {
        h64 ^= (*ptr++) * XXH_PRIME64_5;
        h64 = XXH_rotl64(h64, 11) * XXH_PRIME64_1;
        --len;
    }
    return  XXH64_avalanche(h64);
}